

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_hal.cpp
# Opt level: O0

MPP_RET mpp_enc_hal_prepare(void *hal)

{
  MppEncHalImpl *p;
  void *hal_local;
  
  if (hal == (void *)0x0) {
    _mpp_log_l(2,"mpp_enc_hal","found NULL input ctx %p\n","mpp_enc_hal_prepare",0);
    hal_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else if ((*(long *)((long)hal + 0x10) == 0) ||
          (*(long *)(*(long *)((long)hal + 0x10) + 0x28) == 0)) {
    hal_local._4_4_ = MPP_OK;
  }
  else {
    hal_local._4_4_ =
         (**(code **)(*(long *)((long)hal + 0x10) + 0x28))(*(undefined8 *)((long)hal + 8));
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_hal_prepare(void *hal)
{
    if (NULL == hal) {
        mpp_err_f("found NULL input ctx %p\n", hal);
        return MPP_ERR_NULL_PTR;
    }

    MppEncHalImpl *p = (MppEncHalImpl*)hal;
    if (!p->api || !p->api->prepare)
        return MPP_OK;

    return p->api->prepare(p->ctx);
}